

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::
elapsed_formatter<spdlog::details::null_scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
::format(elapsed_formatter<spdlog::details::null_scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
         *this,log_msg *msg,tm *param_3,memory_buf_t *dest)

{
  uint uVar1;
  type n;
  duration<long,_std::ratio<1L,_1000000000L>_> dest_00;
  unsigned_long uVar2;
  memory_buf_t *in_RCX;
  long in_RSI;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDI;
  null_scoped_padder p;
  size_t n_digits;
  size_t delta_count;
  __enable_if_is_duration<std::chrono::duration<long>_> delta_units;
  duration<long,_std::ratio<1L,_1000000000L>_> delta;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff98;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffa8;
  duration<long,_std::ratio<1L,_1L>_> local_40;
  
  n = std::chrono::operator-(in_stack_ffffffffffffffa8,in_RDI);
  dest_00 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::zero();
  std::max<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (in_stack_ffffffffffffff98,(duration<long,_std::ratio<1L,_1000000000L>_> *)0x149002);
  local_40.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                (in_stack_ffffffffffffff98);
  in_RDI[3].__d.__r = *(rep *)(in_RSI + 0x18);
  uVar2 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_40);
  uVar1 = null_scoped_padder::count_digits<unsigned_long>(uVar2);
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&stack0xffffffffffffffaf,(ulong)uVar1,
             (padding_info *)(in_RDI + 1),in_RCX);
  fmt_helper::append_int<unsigned_long>(n.__r,(memory_buf_t *)dest_00.__r);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto delta = (std::max)(msg.time - last_message_time_, log_clock::duration::zero());
        auto delta_units = std::chrono::duration_cast<DurationUnits>(delta);
        last_message_time_ = msg.time;
        auto delta_count = static_cast<size_t>(delta_units.count());
        auto n_digits = static_cast<size_t>(ScopedPadder::count_digits(delta_count));
        ScopedPadder p(n_digits, padinfo_, dest);
        fmt_helper::append_int(delta_count, dest);
    }